

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::CaseItem>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem> *this,pointer pos,
          CaseItem *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  pointer ppEVar3;
  size_t sVar4;
  undefined8 uVar5;
  RandSeqProductionSymbol *pRVar6;
  size_t sVar7;
  ProdBase PVar8;
  undefined4 uVar9;
  pointer pCVar10;
  long lVar11;
  pointer pCVar12;
  pointer pCVar13;
  long lVar14;
  size_type sVar15;
  ulong uVar16;
  
  if (this->len == 0x2aaaaaaaaaaaaaa) {
    detail::throwLengthError();
  }
  uVar16 = this->len + 1;
  uVar2 = this->cap;
  if (uVar16 < uVar2 * 2) {
    uVar16 = uVar2 * 2;
  }
  if (0x2aaaaaaaaaaaaaa - uVar2 < uVar2) {
    uVar16 = 0x2aaaaaaaaaaaaaa;
  }
  lVar14 = (long)pos - (long)this->data_;
  pCVar10 = (pointer)operator_new(uVar16 * 0x30);
  ppEVar3 = (args->expressions)._M_ptr;
  sVar4 = (args->expressions)._M_extent._M_extent_value;
  uVar5 = *(undefined8 *)&args->item;
  pRVar6 = (args->item).target;
  sVar7 = (args->item).args._M_extent._M_extent_value;
  puVar1 = (undefined8 *)((long)pCVar10 + lVar14 + 0x20);
  *puVar1 = (args->item).args._M_ptr;
  puVar1[1] = sVar7;
  puVar1 = (undefined8 *)((long)pCVar10 + lVar14 + 0x10);
  *puVar1 = uVar5;
  puVar1[1] = pRVar6;
  *(undefined8 *)((long)pCVar10 + lVar14) = ppEVar3;
  ((undefined8 *)((long)pCVar10 + lVar14))[1] = sVar4;
  p = this->data_;
  sVar15 = this->len;
  lVar11 = (long)p + (sVar15 * 0x30 - (long)pos);
  pCVar12 = p;
  pCVar13 = pCVar10;
  if (lVar11 == 0) {
    pCVar12 = pCVar10;
    pCVar13 = p;
    if (sVar15 != 0) {
      do {
        ppEVar3 = (pCVar13->expressions)._M_ptr;
        sVar4 = (pCVar13->expressions)._M_extent._M_extent_value;
        PVar8.kind = (pCVar13->item).super_ProdBase.kind;
        uVar9 = *(undefined4 *)&(pCVar13->item).field_0x4;
        pRVar6 = (pCVar13->item).target;
        sVar7 = (pCVar13->item).args._M_extent._M_extent_value;
        (pCVar12->item).args._M_ptr = (pCVar13->item).args._M_ptr;
        (pCVar12->item).args._M_extent._M_extent_value = sVar7;
        (pCVar12->item).super_ProdBase = (ProdBase)PVar8.kind;
        *(undefined4 *)&(pCVar12->item).field_0x4 = uVar9;
        (pCVar12->item).target = pRVar6;
        (pCVar12->expressions)._M_ptr = ppEVar3;
        (pCVar12->expressions)._M_extent._M_extent_value = sVar4;
        pCVar13 = pCVar13 + 1;
        pCVar12 = pCVar12 + 1;
      } while (pCVar13 != pos);
    }
  }
  else {
    for (; pCVar12 != pos; pCVar12 = pCVar12 + 1) {
      ppEVar3 = (pCVar12->expressions)._M_ptr;
      sVar4 = (pCVar12->expressions)._M_extent._M_extent_value;
      PVar8.kind = (pCVar12->item).super_ProdBase.kind;
      uVar9 = *(undefined4 *)&(pCVar12->item).field_0x4;
      pRVar6 = (pCVar12->item).target;
      sVar7 = (pCVar12->item).args._M_extent._M_extent_value;
      (pCVar13->item).args._M_ptr = (pCVar12->item).args._M_ptr;
      (pCVar13->item).args._M_extent._M_extent_value = sVar7;
      (pCVar13->item).super_ProdBase = (ProdBase)PVar8.kind;
      *(undefined4 *)&(pCVar13->item).field_0x4 = uVar9;
      (pCVar13->item).target = pRVar6;
      (pCVar13->expressions)._M_ptr = ppEVar3;
      (pCVar13->expressions)._M_extent._M_extent_value = sVar4;
      pCVar13 = pCVar13 + 1;
    }
    memcpy((void *)((long)pCVar10 + lVar14 + 0x30),pos,((lVar11 - 0x30U) / 0x30) * 0x30 + 0x30);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar15 = this->len;
  }
  this->len = sVar15 + 1;
  this->cap = uVar16;
  this->data_ = pCVar10;
  return (pointer)((long)pCVar10 + lVar14);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}